

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O1

void __thiscall
RTree::range_search(RTree *this,Polygon *query,vector<Polygon_*,_std::allocator<Polygon_*>_> *ans)

{
  Point PVar1;
  Point PVar2;
  Point PVar3;
  Point PVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  Polygon q;
  Polygon local_40;
  
  PVar1 = query->Pmin;
  PVar2 = query->Pmax;
  PVar3 = PVar1;
  if (PVar2.X < PVar1.X) {
    PVar3 = PVar2;
  }
  PVar4 = PVar1;
  if (PVar1.X < PVar2.X) {
    PVar4 = PVar2;
  }
  uVar7 = PVar2.Y;
  uVar6 = (ulong)PVar1 >> 0x20;
  if ((int)uVar7 < PVar1.Y) {
    uVar6 = (ulong)uVar7;
  }
  uVar5 = (ulong)PVar1 >> 0x20;
  if (PVar1.Y < (int)uVar7) {
    uVar5 = (ulong)PVar2 >> 0x20;
  }
  local_40.Pmin = (Point)((ulong)PVar3 & 0xffffffff | uVar6 << 0x20);
  local_40.Pmax = (Point)((ulong)PVar4 & 0xffffffff | uVar5 << 0x20);
  local_40.key = -1;
  local_40.vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40.vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.corners = 4;
  range_search_recursive(this,this->root,&local_40,ans);
  Polygon::~Polygon(&local_40);
  return;
}

Assistant:

void RTree::range_search(Polygon query, std::vector<Polygon *> & ans){
    int x_min = query.get_Pmin().get_X();
    int y_min = query.get_Pmin().get_Y();
    if(query.get_Pmax().get_X() < x_min)
        x_min = query.get_Pmax().get_X();
    if(query.get_Pmax().get_Y() < y_min)
        y_min = query.get_Pmax().get_Y();
    int x_max = query.get_Pmin().get_X();
    int y_max = query.get_Pmin().get_Y();
    if(query.get_Pmax().get_X() > x_max)
        x_max = query.get_Pmax().get_X();
    if(query.get_Pmax().get_Y() > y_max)
        y_max = query.get_Pmax().get_Y();
    Polygon q(Point(x_min,y_min),Point(x_max,y_max));
    range_search_recursive(this->root, q, ans);
}